

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_sec.c
# Opt level: O1

int CRYPTO_mlock(void *addr,size_t len)

{
  int iVar1;
  
  iVar1 = mlock(addr,len);
  return iVar1;
}

Assistant:

int CRYPTO_mlock(void *const addr, const size_t len)
{
#if defined(MADV_DONTDUMP) && defined(HAVE_MADVISE)
    (void) madvise(addr, len, MADV_DONTDUMP);
#endif
#ifdef HAVE_MLOCK
    return mlock(addr, len);
#elif defined(_WIN32)
    return -(VirtualLock(addr, len) == 0);
#else
    errno = ENOSYS;
    return -1;
#endif
}